

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::dtoa(double value,char *buffer,int maxDecimalPlaces)

{
  undefined8 in_RAX;
  char *pcVar1;
  int K;
  int length;
  undefined8 local_28;
  
  if (0 < maxDecimalPlaces) {
    if ((value != 0.0) || (NAN(value))) {
      if (value < 0.0) {
        *buffer = '-';
        buffer = buffer + 1;
        value = -value;
      }
      local_28 = in_RAX;
      Grisu2(value,buffer,(int *)((long)&local_28 + 4),(int *)&local_28);
      pcVar1 = Prettify(buffer,local_28._4_4_,(int)local_28,maxDecimalPlaces);
    }
    else {
      if ((long)value < 0) {
        *buffer = '-';
        buffer = buffer + 1;
      }
      buffer[0] = '0';
      buffer[1] = '.';
      buffer[2] = '0';
      pcVar1 = buffer + 3;
    }
    return pcVar1;
  }
  __assert_fail("maxDecimalPlaces >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/dtoa.h"
                ,0xd9,"char *rapidjson::internal::dtoa(double, char *, int)");
}

Assistant:

inline char* dtoa(double value, char* buffer, int maxDecimalPlaces = 324) {
    RAPIDJSON_ASSERT(maxDecimalPlaces >= 1);
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K, maxDecimalPlaces);
    }
}